

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O3

double __thiscall COLLADABU::Math::Quaternion::exp(Quaternion *this,double __x)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  long in_RSI;
  double dVar4;
  Real RVar5;
  
  dVar2 = SQRT(*(double *)(in_RSI + 0x18) * *(double *)(in_RSI + 0x18) +
               *(double *)(in_RSI + 8) * *(double *)(in_RSI + 8) +
               *(double *)(in_RSI + 0x10) * *(double *)(in_RSI + 0x10));
  dVar4 = sin(dVar2);
  dVar3 = cos(dVar2);
  this->w = dVar3;
  if (0.001 <= ABS(dVar4)) {
    dVar4 = dVar4 / dVar2;
    dVar2 = dVar4 * *(double *)(in_RSI + 8);
    dVar3 = dVar4 * *(double *)(in_RSI + 0x10);
    RVar5 = dVar4 * *(double *)(in_RSI + 0x18);
  }
  else {
    dVar2 = *(double *)(in_RSI + 8);
    dVar3 = *(double *)(in_RSI + 0x10);
    RVar5 = *(Real *)(in_RSI + 0x18);
  }
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  this->x = dVar2;
  this->y = (Real)auVar1._8_8_;
  this->z = RVar5;
  return dVar2;
}

Assistant:

Quaternion Quaternion::exp () const
        {
            // If q = A*(x*i+y*j+z*k) where (x,y,z) is unit length, then
            // exp(q) = cos(A)+sin(A)*(x*i+y*j+z*k).  If sin(A) is near zero,
            // use exp(q) = cos(A)+A*(x*i+y*j+z*k) since A/sin(A) has limit 1.

            Real fAngle_radian = sqrt( x * x + y * y + z * z );
            Real fSin = sin( fAngle_radian );

            Quaternion kResult;
            kResult.w = cos( fAngle_radian );

            if ( std::abs( fSin ) >= ms_fEpsilon )
            {
                Real fCoeff = fSin / fAngle_radian;
                kResult.x = fCoeff * x;
                kResult.y = fCoeff * y;
                kResult.z = fCoeff * z;
            }

            else
            {
                kResult.x = x;
                kResult.y = y;
                kResult.z = z;
            }

            return kResult;
        }